

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int parseModifier(sqlite3_context *pCtx,char *z,int n,DateTime *p,int idx)

{
  long lVar1;
  undefined4 uVar2;
  int iVar3;
  char *z_00;
  bool bVar4;
  int local_10c;
  bool local_f1;
  int y;
  int x;
  sqlite3_int64 day;
  DateTime tx;
  char *z2;
  int i;
  double rRounder;
  sqlite3_int64 Z;
  DateTime new;
  int iErr;
  int cnt;
  i64 iGuess;
  i64 iOrigJD;
  double r;
  int rc;
  int idx_local;
  DateTime *p_local;
  byte *pbStack_20;
  int n_local;
  char *z_local;
  sqlite3_context *pCtx_local;
  
  r._0_4_ = 1;
  r._4_4_ = idx;
  _rc = p;
  p_local._4_4_ = n;
  pbStack_20 = (byte *)z;
  z_local = (char *)pCtx;
  switch(""[(byte)*z]) {
  case '+':
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    p_local._4_4_ = 1;
    while( true ) {
      bVar4 = false;
      if ((z[(int)p_local._4_4_] != '\0') && (bVar4 = false, z[(int)p_local._4_4_] != ':')) {
        bVar4 = (""[(byte)z[(int)p_local._4_4_]] & 1) == 0;
      }
      if (!bVar4) break;
      p_local._4_4_ = p_local._4_4_ + 1;
    }
    iVar3 = sqlite3AtoF(z,(double *)&iOrigJD,p_local._4_4_,'\x01');
    if (iVar3 < 1) {
      r._0_4_ = 1;
    }
    else if (pbStack_20[(int)p_local._4_4_] == 0x3a) {
      tx._40_8_ = pbStack_20;
      if ((""[*pbStack_20] & 4) == 0) {
        tx._40_8_ = pbStack_20 + 1;
      }
      memset(&day,0,0x30);
      iVar3 = parseHhMmSs((char *)tx._40_8_,(DateTime *)&day);
      if (iVar3 == 0) {
        computeJD((DateTime *)&day);
        day = (day + -43200000) % 86400000;
        if (*pbStack_20 == 0x2d) {
          day = -day;
        }
        computeJD(_rc);
        clearYMD_HMS_TZ(_rc);
        _rc->iJD = day + _rc->iJD;
        r._0_4_ = 0;
      }
    }
    else {
      pbStack_20 = pbStack_20 + (int)p_local._4_4_;
      while ((""[*pbStack_20] & 1) != 0) {
        pbStack_20 = pbStack_20 + 1;
      }
      p_local._4_4_ = sqlite3Strlen30((char *)pbStack_20);
      if (((int)p_local._4_4_ < 0xb) && (2 < (int)p_local._4_4_)) {
        if (""[pbStack_20[(int)(p_local._4_4_ - 1)]] == 's') {
          p_local._4_4_ = p_local._4_4_ - 1;
        }
        computeJD(_rc);
        r._0_4_ = 1;
        bVar4 = (double)iOrigJD < 0.0;
        for (z2._4_4_ = 0; z2._4_4_ < 6; z2._4_4_ = z2._4_4_ + 1) {
          if ((((aXformType[z2._4_4_].nName == p_local._4_4_) &&
               (iVar3 = sqlite3_strnicmp(aXformType[z2._4_4_].zName,(char *)pbStack_20,p_local._4_4_
                                        ), iVar3 == 0)) &&
              ((double)-aXformType[z2._4_4_].rLimit < (double)iOrigJD)) &&
             ((double)iOrigJD < (double)aXformType[z2._4_4_].rLimit)) {
            if (z2._4_4_ == 4) {
              computeYMD_HMS(_rc);
              _rc->M = (int)(double)iOrigJD + _rc->M;
              if (_rc->M < 1) {
                local_10c = _rc->M + -0xc;
              }
              else {
                local_10c = _rc->M + -1;
              }
              local_10c = local_10c / 0xc;
              _rc->Y = local_10c + _rc->Y;
              _rc->M = _rc->M + local_10c * -0xc;
              _rc->validJD = '\0';
              iOrigJD = (i64)((double)iOrigJD - (double)(int)(double)iOrigJD);
            }
            else if (z2._4_4_ == 5) {
              iVar3 = (int)(double)iOrigJD;
              computeYMD_HMS(_rc);
              _rc->Y = iVar3 + _rc->Y;
              _rc->validJD = '\0';
              iOrigJD = (i64)((double)iOrigJD - (double)(int)(double)iOrigJD);
            }
            computeJD(_rc);
            _rc->iJD = (long)((double)iOrigJD * 1000.0 * (double)aXformType[z2._4_4_].rXform +
                             (double)(~-(ulong)bVar4 & 0x3fe0000000000000 |
                                     -(ulong)bVar4 & 0xbfe0000000000000)) + _rc->iJD;
            r._0_4_ = 0;
            break;
          }
        }
        clearYMD_HMS_TZ(_rc);
      }
    }
    break;
  default:
    break;
  case 'a':
    iVar3 = sqlite3_stricmp(z,"auto");
    if (iVar3 == 0) {
      if (1 < r._4_4_) {
        return 1;
      }
      if ((_rc->rawS == '\0') || (_rc->validJD != '\0')) {
        r._0_4_ = 0;
        _rc->rawS = '\0';
      }
      else if ((-210866760000.0 <= _rc->s) && (_rc->s <= 253402300799.0)) {
        iOrigJD = (i64)(_rc->s * 1000.0 + 210866760000000.0);
        clearYMD_HMS_TZ(_rc);
        _rc->iJD = (long)((double)iOrigJD + 0.5);
        _rc->validJD = '\x01';
        _rc->rawS = '\0';
        r._0_4_ = 0;
      }
    }
    break;
  case 'j':
    iVar3 = sqlite3_stricmp(z,"julianday");
    if (iVar3 == 0) {
      if (1 < r._4_4_) {
        return 1;
      }
      if ((_rc->validJD != '\0') && (_rc->rawS != '\0')) {
        r._0_4_ = 0;
        _rc->rawS = '\0';
      }
    }
    break;
  case 'l':
    iVar3 = sqlite3_stricmp(z,"localtime");
    if ((iVar3 == 0) && (iVar3 = sqlite3NotPureFunc((sqlite3_context *)z_local), iVar3 != 0)) {
      r._0_4_ = toLocaltime(_rc,(sqlite3_context *)z_local);
    }
    break;
  case 's':
    iVar3 = sqlite3_strnicmp(z,"start of ",9);
    if ((iVar3 == 0) &&
       (((_rc->validJD != '\0' || (_rc->validYMD != '\0')) || (_rc->validHMS != '\0')))) {
      pbStack_20 = (byte *)((char *)pbStack_20 + 9);
      computeYMD(_rc);
      _rc->validHMS = '\x01';
      _rc->m = 0;
      _rc->h = 0;
      _rc->s = 0.0;
      _rc->rawS = '\0';
      _rc->validTZ = '\0';
      _rc->validJD = '\0';
      iVar3 = sqlite3_stricmp((char *)pbStack_20,"month");
      if (iVar3 == 0) {
        _rc->D = 1;
        r._0_4_ = 0;
      }
      else {
        iVar3 = sqlite3_stricmp((char *)pbStack_20,"year");
        if (iVar3 == 0) {
          _rc->M = 1;
          _rc->D = 1;
          r._0_4_ = 0;
        }
        else {
          iVar3 = sqlite3_stricmp((char *)pbStack_20,"day");
          if (iVar3 == 0) {
            r._0_4_ = 0;
          }
        }
      }
    }
    break;
  case 'u':
    iVar3 = sqlite3_stricmp(z,"unixepoch");
    if ((iVar3 == 0) && (_rc->rawS != '\0')) {
      if (1 < r._4_4_) {
        return 1;
      }
      iOrigJD = (i64)(_rc->s * 1000.0 + 210866760000000.0);
      if ((0.0 <= (double)iOrigJD) && ((double)iOrigJD < 464269060800000.0)) {
        clearYMD_HMS_TZ(_rc);
        _rc->iJD = (long)((double)iOrigJD + 0.5);
        _rc->validJD = '\x01';
        _rc->rawS = '\0';
        r._0_4_ = 0;
      }
    }
    else {
      iVar3 = sqlite3_stricmp((char *)pbStack_20,"utc");
      if ((iVar3 == 0) && (iVar3 = sqlite3NotPureFunc((sqlite3_context *)z_local), iVar3 != 0)) {
        if (_rc->tzSet == '\0') {
          new.validTZ = '\0';
          new.tzSet = '\0';
          new.isError = '\0';
          new._47_1_ = 0;
          computeJD(_rc);
          lVar1 = _rc->iJD;
          new.validJD = '\0';
          new.rawS = '\0';
          new.validYMD = '\0';
          new.validHMS = '\0';
          _iErr = lVar1;
          do {
            memset(&Z,0,0x30);
            _iErr = _iErr - (int)new._40_4_;
            new.s._0_1_ = 1;
            Z = _iErr;
            r._0_4_ = toLocaltime((DateTime *)&Z,(sqlite3_context *)z_local);
            if (r._0_4_ != 0) {
              return r._0_4_;
            }
            computeJD((DateTime *)&Z);
            uVar2 = new._44_4_;
            new._40_4_ = (int)Z - (int)lVar1;
            if (new._40_4_ != 0) {
              new._44_4_ = new._44_4_ + 1;
            }
            local_f1 = new._40_4_ != 0 && (int)uVar2 < 3;
          } while (local_f1);
          memset(_rc,0,0x30);
          _rc->iJD = _iErr;
          _rc->validJD = '\x01';
          _rc->tzSet = '\x01';
        }
        r._0_4_ = 0;
      }
    }
    break;
  case 'w':
    iVar3 = sqlite3_strnicmp(z,"weekday ",8);
    if (iVar3 == 0) {
      z_00 = (char *)pbStack_20 + 8;
      iVar3 = sqlite3Strlen30((char *)pbStack_20 + 8);
      iVar3 = sqlite3AtoF(z_00,(double *)&iOrigJD,iVar3,'\x01');
      if (0 < iVar3) {
        p_local._4_4_ = (uint)(double)iOrigJD;
        if (((((double)(int)p_local._4_4_ == (double)iOrigJD) &&
             (!NAN((double)(int)p_local._4_4_) && !NAN((double)iOrigJD))) &&
            (-1 < (int)p_local._4_4_)) && ((double)iOrigJD < 7.0)) {
          computeYMD_HMS(_rc);
          _rc->validTZ = '\0';
          _rc->validJD = '\0';
          computeJD(_rc);
          rRounder = (double)(((_rc->iJD + 0x7b98a00) / 86400000) % 7);
          if ((long)(int)p_local._4_4_ < (long)rRounder) {
            rRounder = (double)((long)rRounder + -7);
          }
          _rc->iJD = ((long)(int)p_local._4_4_ - (long)rRounder) * 86400000 + _rc->iJD;
          clearYMD_HMS_TZ(_rc);
          r._0_4_ = 0;
        }
      }
    }
  }
  return r._0_4_;
}

Assistant:

static int parseModifier(
  sqlite3_context *pCtx,      /* Function context */
  const char *z,              /* The text of the modifier */
  int n,                      /* Length of zMod in bytes */
  DateTime *p,                /* The date/time value to be modified */
  int idx                     /* Parameter index of the modifier */
){
  int rc = 1;
  double r;
  switch(sqlite3UpperToLower[(u8)z[0]] ){
    case 'a': {
      /*
      **    auto
      **
      ** If rawS is available, then interpret as a julian day number, or
      ** a unix timestamp, depending on its magnitude.
      */
      if( sqlite3_stricmp(z, "auto")==0 ){
        if( idx>1 ) return 1; /* IMP: R-33611-57934 */
        if( !p->rawS || p->validJD ){
          rc = 0;
          p->rawS = 0;
        }else if( p->s>=-21086676*(i64)10000        /* -4713-11-24 12:00:00 */
               && p->s<=(25340230*(i64)10000)+799   /*  9999-12-31 23:59:59 */
        ){
          r = p->s*1000.0 + 210866760000000.0;
          clearYMD_HMS_TZ(p);
          p->iJD = (sqlite3_int64)(r + 0.5);
          p->validJD = 1;
          p->rawS = 0;
          rc = 0;
        }
      }
      break;
    }
    case 'j': {
      /*
      **    julianday
      **
      ** Always interpret the prior number as a julian-day value.  If this
      ** is not the first modifier, or if the prior argument is not a numeric
      ** value in the allowed range of julian day numbers understood by
      ** SQLite (0..5373484.5) then the result will be NULL.
      */
      if( sqlite3_stricmp(z, "julianday")==0 ){
        if( idx>1 ) return 1;  /* IMP: R-31176-64601 */
        if( p->validJD && p->rawS ){
          rc = 0;
          p->rawS = 0;
        }
      }
      break;
    }
#ifndef SQLITE_OMIT_LOCALTIME
    case 'l': {
      /*    localtime
      **
      ** Assuming the current time value is UTC (a.k.a. GMT), shift it to
      ** show local time.
      */
      if( sqlite3_stricmp(z, "localtime")==0 && sqlite3NotPureFunc(pCtx) ){
        rc = toLocaltime(p, pCtx);
      }
      break;
    }
#endif
    case 'u': {
      /*
      **    unixepoch
      **
      ** Treat the current value of p->s as the number of
      ** seconds since 1970.  Convert to a real julian day number.
      */
      if( sqlite3_stricmp(z, "unixepoch")==0 && p->rawS ){
        if( idx>1 ) return 1;  /* IMP: R-49255-55373 */
        r = p->s*1000.0 + 210866760000000.0;
        if( r>=0.0 && r<464269060800000.0 ){
          clearYMD_HMS_TZ(p);
          p->iJD = (sqlite3_int64)(r + 0.5);
          p->validJD = 1;
          p->rawS = 0;
          rc = 0;
        }
      }
#ifndef SQLITE_OMIT_LOCALTIME
      else if( sqlite3_stricmp(z, "utc")==0 && sqlite3NotPureFunc(pCtx) ){
        if( p->tzSet==0 ){
          i64 iOrigJD;              /* Original localtime */
          i64 iGuess;               /* Guess at the corresponding utc time */
          int cnt = 0;              /* Safety to prevent infinite loop */
          int iErr;                 /* Guess is off by this much */

          computeJD(p);
          iGuess = iOrigJD = p->iJD;
          iErr = 0;
          do{
            DateTime new;
            memset(&new, 0, sizeof(new));
            iGuess -= iErr;
            new.iJD = iGuess;
            new.validJD = 1;
            rc = toLocaltime(&new, pCtx);
            if( rc ) return rc;
            computeJD(&new);
            iErr = new.iJD - iOrigJD;
          }while( iErr && cnt++<3 );
          memset(p, 0, sizeof(*p));
          p->iJD = iGuess;
          p->validJD = 1;
          p->tzSet = 1;
        }
        rc = SQLITE_OK;
      }
#endif
      break;
    }
    case 'w': {
      /*
      **    weekday N
      **
      ** Move the date to the same time on the next occurrence of
      ** weekday N where 0==Sunday, 1==Monday, and so forth.  If the
      ** date is already on the appropriate weekday, this is a no-op.
      */
      if( sqlite3_strnicmp(z, "weekday ", 8)==0
               && sqlite3AtoF(&z[8], &r, sqlite3Strlen30(&z[8]), SQLITE_UTF8)>0
               && (n=(int)r)==r && n>=0 && r<7 ){
        sqlite3_int64 Z;
        computeYMD_HMS(p);
        p->validTZ = 0;
        p->validJD = 0;
        computeJD(p);
        Z = ((p->iJD + 129600000)/86400000) % 7;
        if( Z>n ) Z -= 7;
        p->iJD += (n - Z)*86400000;
        clearYMD_HMS_TZ(p);
        rc = 0;
      }
      break;
    }
    case 's': {
      /*
      **    start of TTTTT
      **
      ** Move the date backwards to the beginning of the current day,
      ** or month or year.
      */
      if( sqlite3_strnicmp(z, "start of ", 9)!=0 ) break;
      if( !p->validJD && !p->validYMD && !p->validHMS ) break;
      z += 9;
      computeYMD(p);
      p->validHMS = 1;
      p->h = p->m = 0;
      p->s = 0.0;
      p->rawS = 0;
      p->validTZ = 0;
      p->validJD = 0;
      if( sqlite3_stricmp(z,"month")==0 ){
        p->D = 1;
        rc = 0;
      }else if( sqlite3_stricmp(z,"year")==0 ){
        p->M = 1;
        p->D = 1;
        rc = 0;
      }else if( sqlite3_stricmp(z,"day")==0 ){
        rc = 0;
      }
      break;
    }
    case '+':
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9': {
      double rRounder;
      int i;
      for(n=1; z[n] && z[n]!=':' && !sqlite3Isspace(z[n]); n++){}
      if( sqlite3AtoF(z, &r, n, SQLITE_UTF8)<=0 ){
        rc = 1;
        break;
      }
      if( z[n]==':' ){
        /* A modifier of the form (+|-)HH:MM:SS.FFF adds (or subtracts) the
        ** specified number of hours, minutes, seconds, and fractional seconds
        ** to the time.  The ".FFF" may be omitted.  The ":SS.FFF" may be
        ** omitted.
        */
        const char *z2 = z;
        DateTime tx;
        sqlite3_int64 day;
        if( !sqlite3Isdigit(*z2) ) z2++;
        memset(&tx, 0, sizeof(tx));
        if( parseHhMmSs(z2, &tx) ) break;
        computeJD(&tx);
        tx.iJD -= 43200000;
        day = tx.iJD/86400000;
        tx.iJD -= day*86400000;
        if( z[0]=='-' ) tx.iJD = -tx.iJD;
        computeJD(p);
        clearYMD_HMS_TZ(p);
        p->iJD += tx.iJD;
        rc = 0;
        break;
      }

      /* If control reaches this point, it means the transformation is
      ** one of the forms like "+NNN days".  */
      z += n;
      while( sqlite3Isspace(*z) ) z++;
      n = sqlite3Strlen30(z);
      if( n>10 || n<3 ) break;
      if( sqlite3UpperToLower[(u8)z[n-1]]=='s' ) n--;
      computeJD(p);
      rc = 1;
      rRounder = r<0 ? -0.5 : +0.5;
      for(i=0; i<ArraySize(aXformType); i++){
        if( aXformType[i].nName==n
         && sqlite3_strnicmp(aXformType[i].zName, z, n)==0
         && r>-aXformType[i].rLimit && r<aXformType[i].rLimit
        ){
          switch( i ){
            case 4: { /* Special processing to add months */
              int x;
              assert( strcmp(aXformType[i].zName,"month")==0 );
              computeYMD_HMS(p);
              p->M += (int)r;
              x = p->M>0 ? (p->M-1)/12 : (p->M-12)/12;
              p->Y += x;
              p->M -= x*12;
              p->validJD = 0;
              r -= (int)r;
              break;
            }
            case 5: { /* Special processing to add years */
              int y = (int)r;
              assert( strcmp(aXformType[i].zName,"year")==0 );
              computeYMD_HMS(p);
              p->Y += y;
              p->validJD = 0;
              r -= (int)r;
              break;
            }
          }
          computeJD(p);
          p->iJD += (sqlite3_int64)(r*1000.0*aXformType[i].rXform + rRounder);
          rc = 0;
          break;
        }
      }
      clearYMD_HMS_TZ(p);
      break;
    }
    default: {
      break;
    }
  }
  return rc;
}